

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::RunContext::invokeActiveTestCase(RunContext *this)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    signal(*(int *)((long)&signalDefs + lVar1),FatalConditionHandler::handleSignal);
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x60);
  (*(((this->m_activeTestCase->test).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  lVar1 = 0;
  do {
    signal(*(int *)((long)&signalDefs + lVar1),(__sighandler_t)0x0);
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x60);
  return;
}

Assistant:

void invokeActiveTestCase() {
            FatalConditionHandler fatalConditionHandler; // Handle signals
            m_activeTestCase->invoke();
            fatalConditionHandler.reset();
        }